

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicatevisitor.cpp
# Opt level: O0

void __thiscall
PredicateVisitor::visit(PredicateVisitor *this,Expression *parent,NumberExpression *expression)

{
  bool bVar1;
  NumberExpression *expression_local;
  Expression *parent_local;
  PredicateVisitor *this_local;
  
  bVar1 = std::function<bool_(Expression_*)>::operator()
                    (&this->mPredicate,&expression->super_Expression);
  if (bVar1) {
    this->mHasResult = true;
  }
  return;
}

Assistant:

void PredicateVisitor::visit(Expression* parent, NumberExpression* expression) {
	if (mPredicate(expression)) {
		mHasResult = true;
	}
}